

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreTypeOperations.cpp
# Opt level: O1

string * __thiscall
helics::core::to_string_abi_cxx11_(string *__return_storage_ptr__,core *this,CoreType type)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  
  iVar1 = (int)this;
  switch(iVar1) {
  case 1:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "zmq_";
    pcVar2 = "";
    break;
  case 2:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "mpi_";
    pcVar2 = "";
    break;
  case 3:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "test_";
    pcVar2 = "";
    break;
  case 4:
  case 5:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "ipc_";
    pcVar2 = "";
    break;
  case 6:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "tcp_";
    pcVar2 = "";
    break;
  case 7:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "udp_";
    pcVar2 = "";
    break;
  case 8:
  case 0xd:
  case 0xf:
  case 0x10:
  case 0x11:
switchD_0037fe1a_caseD_8:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  case 9:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "nng_";
    pcVar2 = "";
    break;
  case 10:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "zmqss_";
    pcVar2 = "";
    break;
  case 0xb:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "tcpss_";
    pcVar2 = "";
    break;
  case 0xc:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "http_";
    pcVar2 = "";
    break;
  case 0xe:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "websocket_";
    pcVar2 = "";
    break;
  case 0x12:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "inproc_";
    pcVar2 = "";
    break;
  default:
    if (iVar1 == 0x42) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "null_";
      pcVar2 = "";
    }
    else {
      if (iVar1 != 0x4d) goto switchD_0037fe1a_caseD_8;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "empty_";
      pcVar2 = "";
    }
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(CoreType type)
{
    switch (type) {
        case CoreType::MPI:
            return "mpi_";
        case CoreType::TEST:
            return "test_";
        case CoreType::ZMQ:
            return "zmq_";
        case CoreType::ZMQ_SS:
            return "zmqss_";
        case CoreType::INTERPROCESS:
        case CoreType::IPC:
            return "ipc_";
        case CoreType::TCP:
            return "tcp_";
        case CoreType::TCP_SS:
            return "tcpss_";
        case CoreType::HTTP:
            return "http_";
        case CoreType::UDP:
            return "udp_";
        case CoreType::NNG:
            return "nng_";
        case CoreType::INPROC:
            return "inproc_";
        case CoreType::WEBSOCKET:
            return "websocket_";
        case CoreType::NULLCORE:
            return "null_";
        case CoreType::EMPTY:
            return "empty_";
        default:
            return {};
    }
}